

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_uint8_vector_base64_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,int urlsafe)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint8_t *dst;
  uint *puVar4;
  ulong uVar5;
  int mode;
  ulong uVar6;
  ulong uVar7;
  uint8_t *src;
  size_t data_len;
  ulong local_38;
  
  mode = (int)len;
  puVar4 = (uint *)get_field_ptr(td,id);
  if (puVar4 != (uint *)0x0) {
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = ',';
    }
    print_name(ctx,name,len);
    uVar2 = *puVar4;
    uVar5 = (ulong)*(uint *)((long)puVar4 + (ulong)uVar2);
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + 1;
    *pcVar3 = '\"';
    uVar6 = (uVar5 * 4) / 3 + 3 & 0x3fffffffc;
    data_len = uVar5;
    if (ctx->pflush <= ctx->p + uVar6) {
      (*ctx->flush)(ctx,0);
    }
    src = (uint8_t *)((long)puVar4 + (ulong)uVar2 + 4);
    while( true ) {
      dst = (uint8_t *)ctx->p;
      if (dst + uVar6 <= ctx->pflush) break;
      uVar6 = (long)ctx->pflush - (long)dst & 0xfffffffffffffffc;
      if (uVar6 == 0) {
        __assert_fail("n > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                      ,0x13c,
                      "void print_uint8_vector_base64_object(flatcc_json_printer_t *, const void *, int)"
                     );
      }
      uVar7 = uVar6 * 3 >> 2;
      local_38 = uVar7;
      base64_encode(dst,src,&local_38,(size_t *)(ulong)(urlsafe != 0),mode);
      ctx->p = ctx->p + uVar6;
      src = src + uVar7;
      uVar5 = uVar5 - uVar7;
      data_len = uVar5;
      (*ctx->flush)(ctx,0);
      uVar6 = (uVar5 * 4) / 3 + 3 & 0x7ffffffffffffffc;
    }
    base64_encode(dst,src,&data_len,(size_t *)(ulong)((urlsafe != 0) + 0x80),mode);
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + uVar6 + 1;
    pcVar3[uVar6] = '\"';
  }
  return;
}

Assistant:

void flatcc_json_printer_uint8_vector_base64_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len, int urlsafe)
{
    const void *p = get_field_ptr(td, id);
    int mode;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    mode |= base64_enc_modifier_padding;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_uint8_vector_base64_object(ctx, read_uoffset_ptr(p), mode);
    }
}